

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O3

void __thiscall
OpenMD::EAM::addExplicitInteraction
          (EAM *this,AtomType *atype1,AtomType *atype2,RealType re,RealType alpha,RealType A,
          RealType Ci,RealType Cj)

{
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  *this_00;
  undefined8 *puVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  int i;
  int iVar6;
  long lVar7;
  pair<double,_double> pVar8;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar9;
  int atid2;
  int atid1;
  CubicSplinePtr cs;
  vector<double,_std::allocator<double>_> phiVals;
  vector<double,_std::allocator<double>_> rVals;
  RealType r;
  EAMInteractionData mixer;
  RealType phiCC;
  int local_110;
  int local_10c;
  double local_108;
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  *local_100;
  CubicSpline *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> local_c8;
  double local_b0;
  CubicSpline *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  RealType local_88;
  undefined1 uStack_80;
  undefined7 uStack_7f;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 local_70;
  AtomType *local_68;
  RealType local_60;
  AtomType *local_58;
  RealType local_50;
  RealType local_48;
  RealType local_40;
  RealType local_38;
  
  iVar6 = 0;
  local_f8 = (CubicSpline *)0x0;
  local_108 = re;
  local_68 = atype2;
  local_60 = Ci;
  local_58 = atype1;
  local_50 = Cj;
  local_48 = alpha;
  local_40 = A;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
            (&local_f0,&local_f8,(allocator<OpenMD::CubicSpline> *)&local_a8);
  local_88 = 0.0;
  uStack_80 = 0;
  uStack_7f = 0;
  local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8 = (CubicSpline *)0x0;
  _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  dVar2 = local_108 * 4.0;
  if (dVar2 <= 9.0) {
    dVar2 = 9.0;
  }
  if (12.0 <= dVar2) {
    dVar2 = 12.0;
  }
  local_100 = (vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
               *)(dVar2 / 1999.0);
  do {
    local_b0 = (double)iVar6 * (double)local_100;
    if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_c8,
                 (iterator)
                 local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_b0);
    }
    else {
      *local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_b0;
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_38 = PhiCoreCore(this,local_b0,local_108,local_40,local_48,0.0);
    if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_38);
    }
    else {
      *local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_38;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 2000);
  CubicSpline::addPoints(local_f8,&local_c8,&local_e8);
  local_a8 = local_f8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_a0,&local_f0);
  pVar8 = CubicSpline::getLimits(local_a8);
  local_78 = pVar8.second._0_1_;
  uStack_77 = pVar8.second._1_7_;
  local_88 = local_60;
  uStack_80 = SUB81(local_50,0);
  uStack_7f = (undefined7)((ulong)local_50 >> 8);
  local_70 = 1;
  local_10c = AtomType::getIdent(local_58);
  local_110 = AtomType::getIdent(local_68);
  pVar9 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->EAMtypes,&local_10c);
  if (pVar9.second == false) {
    iVar6 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_10c];
  }
  else {
    iVar6 = this->nEAM_;
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_10c] = iVar6;
    this->nEAM_ = iVar6 + 1;
  }
  pVar9 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->EAMtypes,&local_110);
  if (pVar9.second == false) {
    iVar5 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_110];
    iVar3 = this->nEAM_;
  }
  else {
    iVar5 = this->nEAM_;
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_110] = iVar5;
    iVar3 = iVar5 + 1;
    this->nEAM_ = iVar3;
  }
  this_00 = &this->MixingMap;
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::resize(this_00,(long)iVar3);
  lVar4 = (long)iVar6;
  local_108 = (double)lVar4;
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar4,(long)this->nEAM_);
  lVar7 = (long)iVar5;
  lVar4 = *(long *)&(this_00->
                    super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar4].
                    super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar7 * 0x40 + 8 + lVar4);
  this_01[-1]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8;
  local_100 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this_01,&_Stack_a0);
  this_01[1]._M_pi = local_98;
  lVar4 = lVar4 + lVar7 * 0x40;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar4 + 0x18),&_Stack_90);
  *(RealType *)(lVar4 + 0x20) = local_88;
  *(ulong *)(lVar4 + 0x28) = CONCAT71(uStack_7f,uStack_80);
  *(ulong *)(lVar4 + 0x29) = CONCAT17(local_78,uStack_7f);
  *(ulong *)(lVar4 + 0x31) = CONCAT17(local_70,uStack_77);
  if (iVar5 != iVar6) {
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
              ((this->MixingMap).
               super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar7,(long)this->nEAM_);
    lVar4 = *(long *)&(local_100->
                      super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar7].
                      super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar7 = (long)local_108 * 0x40;
    puVar1 = (undefined8 *)(lVar4 + lVar7);
    *puVar1 = local_a8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1),&_Stack_a0);
    puVar1[2] = local_98;
    lVar4 = lVar4 + lVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar4 + 0x18),&_Stack_90);
    *(RealType *)(lVar4 + 0x20) = local_88;
    *(ulong *)(lVar4 + 0x28) = CONCAT71(uStack_7f,uStack_80);
    *(ulong *)(lVar4 + 0x29) = CONCAT17(local_78,uStack_7f);
    *(ulong *)(lVar4 + 0x31) = CONCAT17(local_70,uStack_77);
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
  }
  if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
  }
  if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
  }
  return;
}

Assistant:

void EAM::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType re, RealType alpha, RealType A,
                                   RealType Ci, RealType Cj) {
    CubicSplinePtr cs {std::make_shared<CubicSpline>()};

    EAMInteractionData mixer;
    std::vector<RealType> rVals;
    std::vector<RealType> phiVals;

    int Nr = 2000;
    RealType r;
    RealType phiCC;

    RealType rcut = std::min(12.0, std::max(9.0, 4.0 * re));
    RealType dr   = rcut / (RealType)(Nr - 1);

    for (int i = 0; i < Nr; i++) {
      r = RealType(i) * dr;
      rVals.push_back(r);
      // for Dream2 and EAMOxide explicit potential we dont care about kappa
      // but it is needed while calling PhiCoreCore. So, lets define it as 0
      // its value however is not used in calculation
      RealType kappa = 0;
      phiCC          = PhiCoreCore(r, re, A, alpha, kappa);
      phiVals.push_back(phiCC);
    }

    cs->addPoints(rVals, phiVals);
    // this is the repulsive piece in explicit EAM Oxide potential
    // this is phiCC for the explicit EAM oxide potential for convinence, it
    // is represented as phi
    mixer.phi  = cs;
    mixer.rcut = mixer.phi->getLimits().second;

    mixer.Ci = Ci;
    mixer.Cj = Cj;

    mixer.explicitlySet = true;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int eamtid1, eamtid2;

    pair<set<int>::iterator, bool> ret;
    ret = EAMtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid1 = EAMtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid1        = nEAM_;
      EAMtids[atid1] = nEAM_;
      nEAM_++;
    }

    ret = EAMtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid2 = EAMtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid2        = nEAM_;
      EAMtids[atid2] = nEAM_;
      nEAM_++;
    }

    MixingMap.resize(nEAM_);
    MixingMap[eamtid1].resize(nEAM_);
    MixingMap[eamtid1][eamtid2] = mixer;
    if (eamtid2 != eamtid1) {
      MixingMap[eamtid2].resize(nEAM_);
      MixingMap[eamtid2][eamtid1] = mixer;
    }
    return;
  }